

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGStreamReaderWriter.cpp
# Opt level: O0

bool __thiscall VCGStreamReaderWriter::Fill(VCGStreamReaderWriter *this)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  element_type *peVar3;
  uchar *puVar4;
  string Error;
  system_error *rError;
  uint local_54;
  undefined1 auStack_50 [4];
  UInt32 BlockLength;
  undefined4 local_3c;
  undefined1 auStack_38 [4];
  uint HeaderSize;
  VCGStreamReaderWriter *local_18;
  VCGStreamReaderWriter *this_local;
  
  local_18 = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pMulticastSocket);
  if (bVar1) {
    ViconCGStreamIO::VBuffer::SetLength(&this->super_VBuffer,0x10000);
    this_00 = std::
              __shared_ptr_access<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<boost::asio::basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_pMulticastSocket);
    puVar4 = ViconCGStreamIO::VBuffer::Raw(&this->super_VBuffer);
    uVar2 = ViconCGStreamIO::VBuffer::Length(&this->super_VBuffer);
    _auStack_38 = (mutable_buffer)boost::asio::buffer(puVar4,(ulong)uVar2);
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::receive<boost::asio::mutable_buffers_1>(this_00,(mutable_buffers_1 *)auStack_38);
    ViconCGStreamIO::VBuffer::SetOffset(&this->super_VBuffer,0);
  }
  else {
    local_3c = 8;
    ViconCGStreamIO::VBuffer::SetLength(&this->super_VBuffer,8);
    ViconCGStreamIO::VBuffer::SetOffset(&this->super_VBuffer,0);
    peVar3 = std::
             __shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_pSocket);
    puVar4 = ViconCGStreamIO::VBuffer::Raw(&this->super_VBuffer);
    uVar2 = ViconCGStreamIO::VBuffer::Length(&this->super_VBuffer);
    _auStack_50 = (mutable_buffer)boost::asio::buffer(puVar4,(ulong)uVar2);
    boost::asio::
    read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
              (peVar3,(mutable_buffers_1 *)auStack_50,(type *)0x0);
    ViconCGStreamIO::VBuffer::SetOffset(&this->super_VBuffer,4);
    local_54 = 0;
    ViconCGStreamIO::VBuffer::Read<unsigned_int>(&this->super_VBuffer,&local_54);
    uVar2 = ViconCGStreamIO::VBuffer::Length(&this->super_VBuffer);
    ViconCGStreamIO::VBuffer::SetLength(&this->super_VBuffer,uVar2 + local_54);
    peVar3 = std::
             __shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_pSocket);
    puVar4 = ViconCGStreamIO::VBuffer::Raw(&this->super_VBuffer);
    _rError = (mutable_buffer)boost::asio::buffer(puVar4 + 8,(ulong)local_54);
    boost::asio::
    read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
              (peVar3,(mutable_buffers_1 *)&rError,(type *)0x0);
    ViconCGStreamIO::VBuffer::SetOffset(&this->super_VBuffer,0);
  }
  return true;
}

Assistant:

bool VCGStreamReaderWriter::Fill()
{
  try
  {
    if( m_pMulticastSocket )
    {
      SetLength( 64 * 1024 );
      m_pMulticastSocket->receive( boost::asio::buffer( Raw(), Length() ) );
      SetOffset( 0 );
    }
    else
    {
      const unsigned int HeaderSize = sizeof( ViconCGStreamType::Enum ) + sizeof( ViconCGStreamType::UInt32 );
      SetLength( HeaderSize );
      SetOffset( 0 );
      boost::asio::read( *m_pSocket, boost::asio::buffer( Raw(), Length() ) );
      
      SetOffset( sizeof( ViconCGStreamType::Enum ) );
      ViconCGStreamType::UInt32 BlockLength = 0;
      Read( BlockLength );
      
      SetLength( Length() + BlockLength );
      boost::asio::read( *m_pSocket, boost::asio::buffer( Raw() + HeaderSize, BlockLength ) );
      SetOffset( 0 );
    }

  } 
  catch( boost::system::system_error & rError )
  {
    std::string Error = rError.what();
    return false;
  }
  
  return true;
}